

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Regex.cpp
# Opt level: O0

ErrCode __thiscall Regex::prepare(Regex *this,string *regex)

{
  char cVar1;
  int iVar2;
  undefined1 *puVar3;
  char *pcVar4;
  Element *pEVar5;
  bool bVar6;
  bool class_created_5;
  bool class_created_4;
  bool class_created_3;
  bool class_created_2;
  bool class_created_1;
  int local_48;
  int iStack_44;
  bool class_created;
  int i;
  int in_group;
  int range_state;
  int state;
  Element *cur_node;
  Element *new_element;
  int rlen;
  string *regex_local;
  Regex *this_local;
  
  iVar2 = std::__cxx11::string::length();
  _range_state = &this->mRoot;
  (this->mRoot).mType = TYPE_SEQUENCE;
  in_group = 0;
  iStack_44 = 0;
  local_48 = 0;
  do {
    if (iVar2 <= local_48) {
      this->mState = STATE_PREPARED;
      return kNoError;
    }
    puVar3 = (undefined1 *)std::__cxx11::string::operator[]((ulong)regex);
    switch(*puVar3) {
    case 0x28:
      if (in_group == 1) {
        pEVar5 = (Element *)
                 operator_new(0x30,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                              ,0x149);
        Element::Element(pEVar5);
        pEVar5->mType = TYPE_TERMINAL;
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)regex);
        pEVar5->mTermStartChar = *pcVar4;
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)regex);
        pEVar5->mTermEndChar = *pcVar4;
        Element::insertChild(_range_state,pEVar5);
      }
      else {
        iStack_44 = iStack_44 + 1;
        pEVar5 = (Element *)
                 operator_new(0x30,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                              ,0x14e);
        Element::Element(pEVar5);
        pEVar5->mType = TYPE_OR;
        Element::insertChild(_range_state,pEVar5);
        _range_state = (Element *)
                       operator_new(0x30,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                                    ,0x153);
        Element::Element(_range_state);
        _range_state->mType = TYPE_SEQUENCE;
        Element::insertChild(pEVar5,_range_state);
      }
      break;
    case 0x29:
      if (iStack_44 < 1) {
        if (in_group == 2) {
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)regex);
          cVar1 = *pcVar4;
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)regex);
          if (cVar1 != *pcVar4) {
            std::__cxx11::string::operator=((string *)&this->mErrorData,"Invalid range definition");
            return kInvalidRequest;
          }
          in_group = 1;
          pEVar5 = Element::getLastChild(_range_state);
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)regex);
          pEVar5->mTermEndChar = *pcVar4;
        }
        else {
          pEVar5 = (Element *)
                   operator_new(0x30,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                                ,0x16d);
          Element::Element(pEVar5);
          pEVar5->mType = TYPE_TERMINAL;
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)regex);
          pEVar5->mTermStartChar = *pcVar4;
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)regex);
          pEVar5->mTermEndChar = *pcVar4;
          Element::insertChild(_range_state,pEVar5);
        }
      }
      else {
        iStack_44 = iStack_44 + -1;
        _range_state = _range_state->mParent->mParent;
      }
      break;
    case 0x2a:
      if (in_group == 1) {
        std::__cxx11::string::operator=
                  ((string *)&this->mErrorData,"Non-excaped * in charater class");
        return kInvalidRequest;
      }
      pEVar5 = Element::getLastChild(_range_state);
      pEVar5->mRepeatMin = 0;
      pEVar5->mRepeatMax = -1;
      bVar6 = true;
      if ((pEVar5->mType != TYPE_CLASS) && (bVar6 = true, pEVar5->mType != TYPE_OR)) {
        bVar6 = pEVar5->mType == TYPE_TERMINAL;
      }
      if (!bVar6) {
        __assert_fail("new_element->mType == TYPE_CLASS ||new_element->mType == TYPE_OR || new_element->mType == TYPE_TERMINAL"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                      ,0xd6,"JetHead::ErrCode Regex::prepare(const std::string &)");
      }
      break;
    case 0x2b:
      if (in_group == 1) {
        std::__cxx11::string::operator=
                  ((string *)&this->mErrorData,"Non-excaped + in charater class");
        return kInvalidRequest;
      }
      pEVar5 = Element::getLastChild(_range_state);
      pEVar5->mRepeatMin = 1;
      pEVar5->mRepeatMax = -1;
      bVar6 = true;
      if ((pEVar5->mType != TYPE_CLASS) && (bVar6 = true, pEVar5->mType != TYPE_OR)) {
        bVar6 = pEVar5->mType == TYPE_TERMINAL;
      }
      if (!bVar6) {
        __assert_fail("new_element->mType == TYPE_CLASS ||new_element->mType == TYPE_OR || new_element->mType == TYPE_TERMINAL"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                      ,0xdf,"JetHead::ErrCode Regex::prepare(const std::string &)");
      }
      break;
    default:
      if (in_group == 2) {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)regex);
        cVar1 = *pcVar4;
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)regex);
        if (cVar1 != *pcVar4) {
          std::__cxx11::string::operator=((string *)&this->mErrorData,"Invalid range definition");
          return kInvalidRequest;
        }
        in_group = 1;
        pEVar5 = Element::getLastChild(_range_state);
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)regex);
        pEVar5->mTermEndChar = *pcVar4;
      }
      else {
        pEVar5 = (Element *)
                 operator_new(0x30,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                              ,0x171);
        Element::Element(pEVar5);
        pEVar5->mType = TYPE_TERMINAL;
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)regex);
        pEVar5->mTermStartChar = *pcVar4;
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)regex);
        pEVar5->mTermEndChar = *pcVar4;
        Element::insertChild(_range_state,pEVar5);
      }
      break;
    case 0x2d:
      if (in_group == 1) {
        pEVar5 = Element::getLastChild(_range_state);
        if (pEVar5->mTermStartChar != pEVar5->mTermEndChar) {
          std::__cxx11::string::operator=
                    ((string *)&this->mErrorData,"Invalid terminal for start of charater range");
          return kInvalidRequest;
        }
        in_group = 2;
      }
      else if (in_group == 2) {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)regex);
        cVar1 = *pcVar4;
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)regex);
        if (cVar1 != *pcVar4) {
          std::__cxx11::string::operator=((string *)&this->mErrorData,"Invalid range definition");
          return kInvalidRequest;
        }
        in_group = 1;
        pEVar5 = Element::getLastChild(_range_state);
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)regex);
        pEVar5->mTermEndChar = *pcVar4;
      }
      else {
        pEVar5 = (Element *)
                 operator_new(0x30,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                              ,0x143);
        Element::Element(pEVar5);
        pEVar5->mType = TYPE_TERMINAL;
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)regex);
        pEVar5->mTermStartChar = *pcVar4;
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)regex);
        pEVar5->mTermEndChar = *pcVar4;
        Element::insertChild(_range_state,pEVar5);
      }
      break;
    case 0x2e:
      if (in_group == 2) {
        std::__cxx11::string::operator=((string *)&this->mErrorData,"Invalid range definition");
        return kInvalidRequest;
      }
      pEVar5 = (Element *)
               operator_new(0x30,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                            ,0xcd);
      Element::Element(pEVar5);
      pEVar5->mType = TYPE_TERMINAL;
      pEVar5->mTermStartChar = '\0';
      pEVar5->mTermEndChar = '\x7f';
      Element::insertChild(_range_state,pEVar5);
      break;
    case 0x3f:
      if (in_group == 1) {
        std::__cxx11::string::operator=
                  ((string *)&this->mErrorData,"Non-excaped ? in charater class");
        return kInvalidRequest;
      }
      pEVar5 = Element::getLastChild(_range_state);
      pEVar5->mRepeatMin = 0;
      pEVar5->mRepeatMax = 1;
      bVar6 = true;
      if ((pEVar5->mType != TYPE_CLASS) && (bVar6 = true, pEVar5->mType != TYPE_OR)) {
        bVar6 = pEVar5->mType == TYPE_TERMINAL;
      }
      if (!bVar6) {
        __assert_fail("new_element->mType == TYPE_CLASS ||new_element->mType == TYPE_OR || new_element->mType == TYPE_TERMINAL"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                      ,0xe8,"JetHead::ErrCode Regex::prepare(const std::string &)");
      }
      break;
    case 0x5b:
      if (in_group == 1) {
        std::__cxx11::string::operator=
                  ((string *)&this->mErrorData,"Non-excaped [ in charater class");
        return kInvalidRequest;
      }
      in_group = 1;
      pEVar5 = (Element *)
               operator_new(0x30,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                            ,0x121);
      Element::Element(pEVar5);
      pEVar5->mType = TYPE_CLASS;
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)regex);
      if (*pcVar4 == '^') {
        pEVar5->mClassInvert = true;
        local_48 = local_48 + 1;
      }
      else {
        pEVar5->mClassInvert = false;
      }
      Element::insertChild(_range_state,pEVar5);
      _range_state = pEVar5;
      break;
    case 0x5c:
      local_48 = local_48 + 1;
      puVar3 = (undefined1 *)std::__cxx11::string::operator[]((ulong)regex);
      switch(*puVar3) {
      case 0x30:
      case 0x78:
        break;
      default:
        if (in_group == 2) {
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)regex);
          cVar1 = *pcVar4;
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)regex);
          if (cVar1 != *pcVar4) {
            std::__cxx11::string::operator=((string *)&this->mErrorData,"Invalid range definition");
            return kInvalidRequest;
          }
          in_group = 1;
          pEVar5 = Element::getLastChild(_range_state);
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)regex);
          pEVar5->mTermEndChar = *pcVar4;
        }
        else {
          pEVar5 = (Element *)
                   operator_new(0x30,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                                ,199);
          Element::Element(pEVar5);
          pEVar5->mType = TYPE_TERMINAL;
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)regex);
          pEVar5->mTermStartChar = *pcVar4;
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)regex);
          pEVar5->mTermEndChar = *pcVar4;
          Element::insertChild(_range_state,pEVar5);
        }
        break;
      case 0x44:
        bVar6 = _range_state->mType != TYPE_CLASS;
        if (bVar6) {
          pEVar5 = (Element *)
                   operator_new(0x30,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                                ,0xac);
          Element::Element(pEVar5);
          pEVar5->mType = TYPE_CLASS;
          pEVar5->mClassInvert = false;
          Element::insertChild(_range_state,pEVar5);
          _range_state = pEVar5;
        }
        _range_state->mClassInvert = true;
        if (in_group == 2) {
          std::__cxx11::string::operator=((string *)&this->mErrorData,"Invalid range definition");
          return kInvalidRequest;
        }
        pEVar5 = (Element *)
                 operator_new(0x30,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                              ,0xae);
        Element::Element(pEVar5);
        pEVar5->mType = TYPE_TERMINAL;
        pEVar5->mTermStartChar = '0';
        pEVar5->mTermEndChar = '9';
        Element::insertChild(_range_state,pEVar5);
        if (bVar6) {
          _range_state = _range_state->mParent;
        }
        break;
      case 0x53:
        bVar6 = _range_state->mType != TYPE_CLASS;
        if (bVar6) {
          pEVar5 = (Element *)
                   operator_new(0x30,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                                ,0x9b);
          Element::Element(pEVar5);
          pEVar5->mType = TYPE_CLASS;
          pEVar5->mClassInvert = false;
          Element::insertChild(_range_state,pEVar5);
          _range_state = pEVar5;
        }
        _range_state->mClassInvert = true;
        if (in_group == 2) {
          in_group = 1;
          pEVar5 = Element::getLastChild(_range_state);
          pEVar5->mTermEndChar = ' ';
        }
        else {
          pEVar5 = (Element *)
                   operator_new(0x30,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                                ,0x9d);
          Element::Element(pEVar5);
          pEVar5->mType = TYPE_TERMINAL;
          pEVar5->mTermStartChar = ' ';
          pEVar5->mTermEndChar = ' ';
          Element::insertChild(_range_state,pEVar5);
        }
        if (in_group == 2) {
          in_group = 1;
          pEVar5 = Element::getLastChild(_range_state);
          pEVar5->mTermEndChar = '\t';
        }
        else {
          pEVar5 = (Element *)
                   operator_new(0x30,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                                ,0x9e);
          Element::Element(pEVar5);
          pEVar5->mType = TYPE_TERMINAL;
          pEVar5->mTermStartChar = '\t';
          pEVar5->mTermEndChar = '\t';
          Element::insertChild(_range_state,pEVar5);
        }
        if (in_group == 2) {
          in_group = 1;
          pEVar5 = Element::getLastChild(_range_state);
          pEVar5->mTermEndChar = '\n';
        }
        else {
          pEVar5 = (Element *)
                   operator_new(0x30,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                                ,0x9f);
          Element::Element(pEVar5);
          pEVar5->mType = TYPE_TERMINAL;
          pEVar5->mTermStartChar = '\n';
          pEVar5->mTermEndChar = '\n';
          Element::insertChild(_range_state,pEVar5);
        }
        if (in_group == 2) {
          in_group = 1;
          pEVar5 = Element::getLastChild(_range_state);
          pEVar5->mTermEndChar = '\r';
        }
        else {
          pEVar5 = (Element *)
                   operator_new(0x30,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                                ,0xa0);
          Element::Element(pEVar5);
          pEVar5->mType = TYPE_TERMINAL;
          pEVar5->mTermStartChar = '\r';
          pEVar5->mTermEndChar = '\r';
          Element::insertChild(_range_state,pEVar5);
        }
        if (in_group == 2) {
          in_group = 1;
          pEVar5 = Element::getLastChild(_range_state);
          pEVar5->mTermEndChar = '\f';
        }
        else {
          pEVar5 = (Element *)
                   operator_new(0x30,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                                ,0xa1);
          Element::Element(pEVar5);
          pEVar5->mType = TYPE_TERMINAL;
          pEVar5->mTermStartChar = '\f';
          pEVar5->mTermEndChar = '\f';
          Element::insertChild(_range_state,pEVar5);
        }
        if (bVar6) {
          _range_state = _range_state->mParent;
        }
        break;
      case 0x57:
        bVar6 = _range_state->mType != TYPE_CLASS;
        if (bVar6) {
          pEVar5 = (Element *)
                   operator_new(0x30,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                                ,0x87);
          Element::Element(pEVar5);
          pEVar5->mType = TYPE_CLASS;
          pEVar5->mClassInvert = false;
          Element::insertChild(_range_state,pEVar5);
          _range_state = pEVar5;
        }
        _range_state->mClassInvert = true;
        if (in_group == 2) {
          std::__cxx11::string::operator=((string *)&this->mErrorData,"Invalid range definition");
          return kInvalidRequest;
        }
        pEVar5 = (Element *)
                 operator_new(0x30,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                              ,0x89);
        Element::Element(pEVar5);
        pEVar5->mType = TYPE_TERMINAL;
        pEVar5->mTermStartChar = 'a';
        pEVar5->mTermEndChar = 'z';
        Element::insertChild(_range_state,pEVar5);
        if (in_group == 2) {
          std::__cxx11::string::operator=((string *)&this->mErrorData,"Invalid range definition");
          return kInvalidRequest;
        }
        pEVar5 = (Element *)
                 operator_new(0x30,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                              ,0x8a);
        Element::Element(pEVar5);
        pEVar5->mType = TYPE_TERMINAL;
        pEVar5->mTermStartChar = 'A';
        pEVar5->mTermEndChar = 'Z';
        Element::insertChild(_range_state,pEVar5);
        if (in_group == 2) {
          std::__cxx11::string::operator=((string *)&this->mErrorData,"Invalid range definition");
          return kInvalidRequest;
        }
        pEVar5 = (Element *)
                 operator_new(0x30,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                              ,0x8b);
        Element::Element(pEVar5);
        pEVar5->mType = TYPE_TERMINAL;
        pEVar5->mTermStartChar = '0';
        pEVar5->mTermEndChar = '9';
        Element::insertChild(_range_state,pEVar5);
        if (in_group == 2) {
          in_group = 1;
          pEVar5 = Element::getLastChild(_range_state);
          pEVar5->mTermEndChar = '_';
        }
        else {
          pEVar5 = (Element *)
                   operator_new(0x30,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                                ,0x8c);
          Element::Element(pEVar5);
          pEVar5->mType = TYPE_TERMINAL;
          pEVar5->mTermStartChar = '_';
          pEVar5->mTermEndChar = '_';
          Element::insertChild(_range_state,pEVar5);
        }
        if (bVar6) {
          _range_state = _range_state->mParent;
        }
        break;
      case 100:
        bVar6 = _range_state->mType != TYPE_CLASS;
        if (bVar6) {
          pEVar5 = (Element *)
                   operator_new(0x30,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                                ,0xa6);
          Element::Element(pEVar5);
          pEVar5->mType = TYPE_CLASS;
          pEVar5->mClassInvert = false;
          Element::insertChild(_range_state,pEVar5);
          _range_state = pEVar5;
        }
        if (in_group == 2) {
          std::__cxx11::string::operator=((string *)&this->mErrorData,"Invalid range definition");
          return kInvalidRequest;
        }
        pEVar5 = (Element *)
                 operator_new(0x30,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                              ,0xa7);
        Element::Element(pEVar5);
        pEVar5->mType = TYPE_TERMINAL;
        pEVar5->mTermStartChar = '0';
        pEVar5->mTermEndChar = '9';
        Element::insertChild(_range_state,pEVar5);
        if (bVar6) {
          _range_state = _range_state->mParent;
        }
        break;
      case 0x66:
        if (in_group == 2) {
          in_group = 1;
          pEVar5 = Element::getLastChild(_range_state);
          pEVar5->mTermEndChar = '\f';
        }
        else {
          pEVar5 = (Element *)
                   operator_new(0x30,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                                ,0xbf);
          Element::Element(pEVar5);
          pEVar5->mType = TYPE_TERMINAL;
          pEVar5->mTermStartChar = '\f';
          pEVar5->mTermEndChar = '\f';
          Element::insertChild(_range_state,pEVar5);
        }
        break;
      case 0x6e:
        if (in_group == 2) {
          in_group = 1;
          pEVar5 = Element::getLastChild(_range_state);
          pEVar5->mTermEndChar = '\n';
        }
        else {
          pEVar5 = (Element *)
                   operator_new(0x30,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                                ,0xb7);
          Element::Element(pEVar5);
          pEVar5->mType = TYPE_TERMINAL;
          pEVar5->mTermStartChar = '\n';
          pEVar5->mTermEndChar = '\n';
          Element::insertChild(_range_state,pEVar5);
        }
        break;
      case 0x72:
        if (in_group == 2) {
          in_group = 1;
          pEVar5 = Element::getLastChild(_range_state);
          pEVar5->mTermEndChar = '\r';
        }
        else {
          pEVar5 = (Element *)
                   operator_new(0x30,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                                ,0xbb);
          Element::Element(pEVar5);
          pEVar5->mType = TYPE_TERMINAL;
          pEVar5->mTermStartChar = '\r';
          pEVar5->mTermEndChar = '\r';
          Element::insertChild(_range_state,pEVar5);
        }
        break;
      case 0x73:
        bVar6 = _range_state->mType != TYPE_CLASS;
        if (bVar6) {
          pEVar5 = (Element *)
                   operator_new(0x30,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                                ,0x91);
          Element::Element(pEVar5);
          pEVar5->mType = TYPE_CLASS;
          pEVar5->mClassInvert = false;
          Element::insertChild(_range_state,pEVar5);
          _range_state = pEVar5;
        }
        if (in_group == 2) {
          in_group = 1;
          pEVar5 = Element::getLastChild(_range_state);
          pEVar5->mTermEndChar = ' ';
        }
        else {
          pEVar5 = (Element *)
                   operator_new(0x30,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                                ,0x92);
          Element::Element(pEVar5);
          pEVar5->mType = TYPE_TERMINAL;
          pEVar5->mTermStartChar = ' ';
          pEVar5->mTermEndChar = ' ';
          Element::insertChild(_range_state,pEVar5);
        }
        if (in_group == 2) {
          in_group = 1;
          pEVar5 = Element::getLastChild(_range_state);
          pEVar5->mTermEndChar = '\t';
        }
        else {
          pEVar5 = (Element *)
                   operator_new(0x30,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                                ,0x93);
          Element::Element(pEVar5);
          pEVar5->mType = TYPE_TERMINAL;
          pEVar5->mTermStartChar = '\t';
          pEVar5->mTermEndChar = '\t';
          Element::insertChild(_range_state,pEVar5);
        }
        if (in_group == 2) {
          in_group = 1;
          pEVar5 = Element::getLastChild(_range_state);
          pEVar5->mTermEndChar = '\n';
        }
        else {
          pEVar5 = (Element *)
                   operator_new(0x30,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                                ,0x94);
          Element::Element(pEVar5);
          pEVar5->mType = TYPE_TERMINAL;
          pEVar5->mTermStartChar = '\n';
          pEVar5->mTermEndChar = '\n';
          Element::insertChild(_range_state,pEVar5);
        }
        if (in_group == 2) {
          in_group = 1;
          pEVar5 = Element::getLastChild(_range_state);
          pEVar5->mTermEndChar = '\r';
        }
        else {
          pEVar5 = (Element *)
                   operator_new(0x30,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                                ,0x95);
          Element::Element(pEVar5);
          pEVar5->mType = TYPE_TERMINAL;
          pEVar5->mTermStartChar = '\r';
          pEVar5->mTermEndChar = '\r';
          Element::insertChild(_range_state,pEVar5);
        }
        if (in_group == 2) {
          in_group = 1;
          pEVar5 = Element::getLastChild(_range_state);
          pEVar5->mTermEndChar = '\f';
        }
        else {
          pEVar5 = (Element *)
                   operator_new(0x30,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                                ,0x96);
          Element::Element(pEVar5);
          pEVar5->mType = TYPE_TERMINAL;
          pEVar5->mTermStartChar = '\f';
          pEVar5->mTermEndChar = '\f';
          Element::insertChild(_range_state,pEVar5);
        }
        if (bVar6) {
          _range_state = _range_state->mParent;
        }
        break;
      case 0x74:
        if (in_group == 2) {
          in_group = 1;
          pEVar5 = Element::getLastChild(_range_state);
          pEVar5->mTermEndChar = '\t';
        }
        else {
          pEVar5 = (Element *)
                   operator_new(0x30,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                                ,0xb3);
          Element::Element(pEVar5);
          pEVar5->mType = TYPE_TERMINAL;
          pEVar5->mTermStartChar = '\t';
          pEVar5->mTermEndChar = '\t';
          Element::insertChild(_range_state,pEVar5);
        }
        break;
      case 0x77:
        bVar6 = _range_state->mType != TYPE_CLASS;
        if (bVar6) {
          pEVar5 = (Element *)
                   operator_new(0x30,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                                ,0x7e);
          Element::Element(pEVar5);
          pEVar5->mType = TYPE_CLASS;
          pEVar5->mClassInvert = false;
          Element::insertChild(_range_state,pEVar5);
          _range_state = pEVar5;
        }
        if (in_group == 2) {
          std::__cxx11::string::operator=((string *)&this->mErrorData,"Invalid range definition");
          return kInvalidRequest;
        }
        pEVar5 = (Element *)
                 operator_new(0x30,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                              ,0x7f);
        Element::Element(pEVar5);
        pEVar5->mType = TYPE_TERMINAL;
        pEVar5->mTermStartChar = 'a';
        pEVar5->mTermEndChar = 'z';
        Element::insertChild(_range_state,pEVar5);
        if (in_group == 2) {
          std::__cxx11::string::operator=((string *)&this->mErrorData,"Invalid range definition");
          return kInvalidRequest;
        }
        pEVar5 = (Element *)
                 operator_new(0x30,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                              ,0x80);
        Element::Element(pEVar5);
        pEVar5->mType = TYPE_TERMINAL;
        pEVar5->mTermStartChar = 'A';
        pEVar5->mTermEndChar = 'Z';
        Element::insertChild(_range_state,pEVar5);
        if (in_group == 2) {
          std::__cxx11::string::operator=((string *)&this->mErrorData,"Invalid range definition");
          return kInvalidRequest;
        }
        pEVar5 = (Element *)
                 operator_new(0x30,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                              ,0x81);
        Element::Element(pEVar5);
        pEVar5->mType = TYPE_TERMINAL;
        pEVar5->mTermStartChar = '0';
        pEVar5->mTermEndChar = '9';
        Element::insertChild(_range_state,pEVar5);
        if (in_group == 2) {
          in_group = 1;
          pEVar5 = Element::getLastChild(_range_state);
          pEVar5->mTermEndChar = '_';
        }
        else {
          pEVar5 = (Element *)
                   operator_new(0x30,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                                ,0x82);
          Element::Element(pEVar5);
          pEVar5->mType = TYPE_TERMINAL;
          pEVar5->mTermStartChar = '_';
          pEVar5->mTermEndChar = '_';
          Element::insertChild(_range_state,pEVar5);
        }
        if (bVar6) {
          _range_state = _range_state->mParent;
        }
      }
      break;
    case 0x5d:
      if (in_group == 1) {
        _range_state = _range_state->mParent;
        in_group = 0;
      }
      else {
        if (in_group == 2) {
          std::__cxx11::string::operator=
                    ((string *)&this->mErrorData,
                     "Non-escaped square bracket at end of charater range");
          return kInvalidRequest;
        }
        if (in_group == 2) {
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)regex);
          cVar1 = *pcVar4;
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)regex);
          if (cVar1 != *pcVar4) {
            std::__cxx11::string::operator=((string *)&this->mErrorData,"Invalid range definition");
            return kInvalidRequest;
          }
          in_group = 1;
          pEVar5 = Element::getLastChild(_range_state);
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)regex);
          pEVar5->mTermEndChar = *pcVar4;
        }
        else {
          pEVar5 = (Element *)
                   operator_new(0x30,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                                ,0x137);
          Element::Element(pEVar5);
          pEVar5->mType = TYPE_TERMINAL;
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)regex);
          pEVar5->mTermStartChar = *pcVar4;
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)regex);
          pEVar5->mTermEndChar = *pcVar4;
          Element::insertChild(_range_state,pEVar5);
        }
      }
      break;
    case 0x7b:
      if (in_group == 1) {
        std::__cxx11::string::operator=
                  ((string *)&this->mErrorData,"Non-excaped { in charater class");
        return kInvalidRequest;
      }
      pEVar5 = Element::getLastChild(_range_state);
      pEVar5->mRepeatMin = 0;
      pEVar5->mRepeatMax = 0;
      bVar6 = true;
      if ((pEVar5->mType != TYPE_CLASS) && (bVar6 = true, pEVar5->mType != TYPE_OR)) {
        bVar6 = pEVar5->mType == TYPE_TERMINAL;
      }
      if (!bVar6) {
        __assert_fail("new_element->mType == TYPE_CLASS ||new_element->mType == TYPE_OR || new_element->mType == TYPE_TERMINAL"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                      ,0xf2,"JetHead::ErrCode Regex::prepare(const std::string &)");
      }
      i = 4;
      while( true ) {
        local_48 = local_48 + 1;
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)regex);
        if (*pcVar4 == '}') break;
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)regex);
        if (*pcVar4 == ',') {
          if (i != 4) {
            std::__cxx11::string::operator=
                      ((string *)&this->mErrorData,"Too many commons in repetition range");
            return kInvalidRequest;
          }
          i = 3;
        }
        else {
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)regex);
          if ((*pcVar4 < '0') ||
             (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)regex), '9' < *pcVar4)) {
            std::__cxx11::string::operator=
                      ((string *)&this->mErrorData,"Non-numeric value in repetition range");
            return kInvalidRequest;
          }
          if (i == 4) {
            pEVar5->mRepeatMin = pEVar5->mRepeatMin * 10;
            pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)regex);
            pEVar5->mRepeatMin = *pcVar4 + -0x30 + pEVar5->mRepeatMin;
          }
          else {
            if (i != 3) {
              std::__cxx11::string::operator=((string *)&this->mErrorData,"Internal Error");
              return kInvalidRequest;
            }
            pEVar5->mRepeatMax = pEVar5->mRepeatMax * 10;
            pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)regex);
            pEVar5->mRepeatMax = *pcVar4 + -0x30 + pEVar5->mRepeatMax;
          }
        }
      }
      if (i == 4) {
        pEVar5->mRepeatMax = pEVar5->mRepeatMin;
      }
      break;
    case 0x7c:
      if (iStack_44 < 1) {
        if (in_group == 2) {
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)regex);
          cVar1 = *pcVar4;
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)regex);
          if (cVar1 != *pcVar4) {
            std::__cxx11::string::operator=((string *)&this->mErrorData,"Invalid range definition");
            return kInvalidRequest;
          }
          in_group = 1;
          pEVar5 = Element::getLastChild(_range_state);
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)regex);
          pEVar5->mTermEndChar = *pcVar4;
        }
        else {
          pEVar5 = (Element *)
                   operator_new(0x30,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                                ,0x163);
          Element::Element(pEVar5);
          pEVar5->mType = TYPE_TERMINAL;
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)regex);
          pEVar5->mTermStartChar = *pcVar4;
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)regex);
          pEVar5->mTermEndChar = *pcVar4;
          Element::insertChild(_range_state,pEVar5);
        }
      }
      else {
        pEVar5 = (Element *)
                 operator_new(0x30,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                              ,0x15d);
        Element::Element(pEVar5);
        pEVar5->mType = TYPE_SEQUENCE;
        Element::insertChild(_range_state->mParent,pEVar5);
        _range_state = pEVar5;
      }
    }
    local_48 = local_48 + 1;
  } while( true );
}

Assistant:

JetHead::ErrCode	Regex::prepare( const JHSTD::string &regex )
{
	int rlen = regex.length();
	Element *new_element = NULL;
	Element *cur_node = &mRoot;
	
	cur_node->mType = TYPE_SEQUENCE;
	int state = IN_UNKNOWN;
	int range_state;
	int in_group = 0;
	
	for ( int i = 0; i < rlen; i++ )
	{
		switch ( regex[ i ] ) 
		{
			case '\\':
				i += 1;
		
				switch( regex[ i ] )
				{
					case 'w':
						CHECK_CLASS
						ADD_TERMINAL( 'a', 'z' );
						ADD_TERMINAL( 'A', 'Z' );
						ADD_TERMINAL( '0', '9' );
						ADD_TERMINAL( '_', '_' );
						END_CLASS
						break;

					case 'W':
						CHECK_CLASS
						cur_node->mClassInvert = true;
						ADD_TERMINAL( 'a', 'z' );
						ADD_TERMINAL( 'A', 'Z' );
						ADD_TERMINAL( '0', '9' );
						ADD_TERMINAL( '_', '_' );
						END_CLASS
						break;
						
					case 's':
						CHECK_CLASS
						ADD_TERMINAL( ' ', ' ' );
						ADD_TERMINAL( '\t', '\t' );
						ADD_TERMINAL( '\n', '\n' );
						ADD_TERMINAL( '\r', '\r' );
						ADD_TERMINAL( '\f', '\f' );
						END_CLASS
						break;

					case 'S':
						CHECK_CLASS
						cur_node->mClassInvert = true;
						ADD_TERMINAL( ' ', ' ' );
						ADD_TERMINAL( '\t', '\t' );
						ADD_TERMINAL( '\n', '\n' );
						ADD_TERMINAL( '\r', '\r' );
						ADD_TERMINAL( '\f', '\f' );
						END_CLASS
						break;

					case 'd':
						CHECK_CLASS
						ADD_TERMINAL( '0', '9' );
						END_CLASS
						break;

					case 'D':
						CHECK_CLASS
						cur_node->mClassInvert = true;
						ADD_TERMINAL( '0', '9' );
						END_CLASS
						break;

					case 't':
						ADD_TERMINAL( '\t', '\t' );
						break;

					case 'n':
						ADD_TERMINAL( '\n', '\n' );
						break;
					
					case 'r':
						ADD_TERMINAL( '\r', '\r' );
						break;
				
					case 'f':
						ADD_TERMINAL( '\f', '\f' );
						break;
						
					case '0':
					case 'x':
						break;
						
					default:
						ADD_TERMINAL( regex[ i ], regex[ i ] );
						break;
				}
				break;
				
			case '.':
				ADD_TERMINAL( 0, 127 );
				break;
				
			case '*':
				if ( state == IN_CLASS )
					PARSE_ERROR( "Non-excaped * in charater class" )
				new_element = cur_node->getLastChild();
				new_element->mRepeatMin = 0;
				new_element->mRepeatMax = -1;
				assert( new_element->mType == TYPE_CLASS ||new_element->mType == TYPE_OR || new_element->mType == TYPE_TERMINAL );
				break;
				
			case '+':
				if ( state == IN_CLASS )
					PARSE_ERROR( "Non-excaped + in charater class" )
				new_element = cur_node->getLastChild();
				new_element->mRepeatMin = 1;
				new_element->mRepeatMax = -1;
				assert( new_element->mType == TYPE_CLASS ||new_element->mType == TYPE_OR || new_element->mType == TYPE_TERMINAL );
				break;

			case '?':
				if ( state == IN_CLASS )
					PARSE_ERROR( "Non-excaped ? in charater class" )
				new_element = cur_node->getLastChild();
				new_element->mRepeatMin = 0;
				new_element->mRepeatMax = 1;
				assert( new_element->mType == TYPE_CLASS ||new_element->mType == TYPE_OR || new_element->mType == TYPE_TERMINAL );
				break;
				
			case '{':
				if ( state == IN_CLASS )
					PARSE_ERROR( "Non-excaped { in charater class" )
				i += 1;
				new_element = cur_node->getLastChild();
				new_element->mRepeatMin = 0;
				new_element->mRepeatMax = 0;
				assert( new_element->mType == TYPE_CLASS ||new_element->mType == TYPE_OR || new_element->mType == TYPE_TERMINAL );
				range_state = IN_RANGE_MIN;
				while( regex[ i ] != '}' )
				{
					switch( regex[ i ] )
					{
						case ',':
							if ( range_state == IN_RANGE_MIN )
								range_state = IN_RANGE_MAX;
							else
								PARSE_ERROR( "Too many commons in repetition range" )
							break;
							
						default:
							if ( regex[ i ] >= '0' && regex[ i ] <= '9' )
							{
								if ( range_state == IN_RANGE_MIN )
								{
									new_element->mRepeatMin *= 10;
									new_element->mRepeatMin += regex[ i ] - '0';
								}
								else if ( range_state == IN_RANGE_MAX )
								{
									new_element->mRepeatMax *= 10;
									new_element->mRepeatMax += regex[ i ] - '0';
								}
								else
									PARSE_ERROR( "Internal Error" )
							}
							else
								PARSE_ERROR( "Non-numeric value in repetition range" )
					}
					
					i += 1;
				}

				if ( range_state == IN_RANGE_MIN )
					new_element->mRepeatMax = new_element->mRepeatMin;				
				
				LOG_NOTICE( "Range set to %d -> %d", new_element->mRepeatMin, new_element->mRepeatMax );
				break;

			case '[':
				if ( state == IN_CLASS )
					PARSE_ERROR( "Non-excaped [ in charater class" )

				state = IN_CLASS;
				new_element = jh_new Element;
				new_element->mType = TYPE_CLASS;
				if ( regex[ i + 1 ] == '^' )
				{
					new_element->mClassInvert = true;
					i += 1;
				}
				else
					new_element->mClassInvert = false;
				cur_node->insertChild( new_element );
				cur_node = new_element;
				break;
								
			case ']':
				if ( state == IN_CLASS )
				{
					cur_node = cur_node->mParent;
					state = IN_UNKNOWN;
				}
				else if ( state == IN_CLASS_THRU )
					PARSE_ERROR( "Non-escaped square bracket at end of charater range" )
				else
					ADD_TERMINAL( regex[ i ], regex[ i ] );
				break;

			case '-':
				if ( state == IN_CLASS )
				{
					new_element = cur_node->getLastChild();
					if ( new_element->mTermStartChar != new_element->mTermEndChar )
						PARSE_ERROR( "Invalid terminal for start of charater range" )
					state = IN_CLASS_THRU;
				}
				else
					ADD_TERMINAL( regex[ i ], regex[ i ] );
				break;
			
			case '(':
				if ( state == IN_CLASS )
				{
					ADD_TERMINAL( regex[ i ], regex[ i ] );
				}
				else
				{
					in_group += 1;
					new_element = jh_new Element;
					new_element->mType = TYPE_OR;
					cur_node->insertChild( new_element );
					cur_node = new_element;
	
					new_element = jh_new Element;
					new_element->mType = TYPE_SEQUENCE;
					cur_node->insertChild( new_element );
					cur_node = new_element;
				}
				break;

			case '|':
				if ( in_group > 0 )
				{
					new_element = jh_new Element;
					new_element->mType = TYPE_SEQUENCE;
					cur_node->mParent->insertChild( new_element );
					cur_node = new_element;
				}
				else
					ADD_TERMINAL( regex[ i ], regex[ i ] );
				break;

			case ')':
				if ( in_group > 0 )
				{
					in_group -= 1;
					cur_node = cur_node->mParent->mParent;
				}
				else
					ADD_TERMINAL( regex[ i ], regex[ i ] );
				break;
					
			default:
				ADD_TERMINAL( regex[ i ], regex[ i ] );
				break;
		}
	}
			
	mState = Regex::STATE_PREPARED;
	return JetHead::kNoError;
}